

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t exr_set_name(exr_context_t ctxt,int part_index,char *val)

{
  char *pcVar1;
  int iVar2;
  size_t __n;
  char *in_RDX;
  int in_ESI;
  char *in_RDI;
  exr_attribute_list_t *unaff_retaddr;
  exr_attribute_t *pname;
  int pidx;
  exr_priv_part_t part;
  exr_attribute_t **in_stack_00000020;
  exr_result_t rv;
  exr_attribute_t *attr;
  size_t bytes;
  exr_const_context_t_conflict in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  exr_attr_string_t *s;
  undefined4 in_stack_ffffffffffffffc8;
  exr_result_t eVar3;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  eVar3 = 0;
  if (in_RDI == (char *)0x0) {
    eVar3 = 2;
  }
  else {
    internal_exr_lock(in_stack_ffffffffffffffb0);
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      internal_exr_unlock(in_stack_ffffffffffffffb0);
      eVar3 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      s = *(exr_attr_string_t **)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
      if (*in_RDI == '\0') {
        internal_exr_unlock(in_stack_ffffffffffffffb0);
        eVar3 = (**(code **)(in_RDI + 0x38))(in_RDI,8);
      }
      else if (*in_RDI == '\x03') {
        internal_exr_unlock(in_stack_ffffffffffffffb0);
        eVar3 = (**(code **)(in_RDI + 0x38))(in_RDI,0x15);
      }
      else {
        if (s[6].str == (char *)0x0) {
          eVar3 = exr_attr_list_add((exr_context_t)pname,unaff_retaddr,
                                    (char *)CONCAT44(in_stack_fffffffffffffffc,
                                                     in_stack_fffffffffffffff8),
                                    (exr_attribute_type_t)((ulong)in_RDI >> 0x20),(int32_t)in_RDI,
                                    (uint8_t **)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                    in_stack_00000020);
        }
        else if (*(int *)(s[6].str + 0x14) != 0x13) {
          internal_exr_unlock(in_stack_ffffffffffffffb0);
          eVar3 = (**(code **)(in_RDI + 0x48))
                            (in_RDI,6,"Invalid required attribute type \'%s\' for \'%s\'",
                             *(undefined8 *)(s[6].str + 8),"name");
          return eVar3;
        }
        pcVar1 = s[6].str;
        if (in_RDX == (char *)0x0) {
          internal_exr_unlock(in_stack_ffffffffffffffb0);
          eVar3 = (**(code **)(in_RDI + 0x40))
                            (in_RDI,3,"Invalid string passed trying to set \'name\'");
        }
        else {
          __n = strlen(in_RDX);
          if (__n < 0x7fffffff) {
            if (eVar3 == 0) {
              if (1 < *(int *)(in_RDI + 0xc4)) {
                for (in_stack_ffffffffffffffbc = 0;
                    in_stack_ffffffffffffffbc < *(int *)(in_RDI + 0xc4);
                    in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc + 1) {
                  if (in_stack_ffffffffffffffbc != in_ESI) {
                    in_stack_ffffffffffffffb0 =
                         *(exr_const_context_t_conflict *)
                          (*(long *)(*(long *)(in_RDI + 0x1d8) + (long)in_stack_ffffffffffffffbc * 8
                                    ) + 0x68);
                    if (in_stack_ffffffffffffffb0 == (exr_const_context_t_conflict)0x0) {
                      internal_exr_unlock((exr_const_context_t_conflict)0x0);
                      eVar3 = (**(code **)(in_RDI + 0x48))
                                        (in_RDI,3,
                                         "Part %d missing required attribute \'name\' for multi-part file"
                                         ,in_stack_ffffffffffffffbc);
                      return eVar3;
                    }
                    iVar2 = strcmp(in_RDX,*(char **)(*(long *)&in_stack_ffffffffffffffb0->
                                                               tmp_filename + 8));
                    if (iVar2 == 0) {
                      internal_exr_unlock(in_stack_ffffffffffffffb0);
                      eVar3 = (**(code **)(in_RDI + 0x48))
                                        (in_RDI,3,
                                         "Each part should have a unique name, part %d and %d attempting to have same name \'%s\'"
                                         ,in_stack_ffffffffffffffbc,in_ESI,in_RDX);
                      return eVar3;
                    }
                  }
                }
              }
              if ((**(int **)(pcVar1 + 0x18) == (int)__n) &&
                 (0 < *(int *)(*(long *)(pcVar1 + 0x18) + 4))) {
                memcpy(*(void **)(*(long *)(pcVar1 + 0x18) + 8),in_RDX,__n);
              }
              else {
                if ((*in_RDI != '\x01') && (*in_RDI != '\x04')) {
                  internal_exr_unlock(in_stack_ffffffffffffffb0);
                  eVar3 = (**(code **)(in_RDI + 0x48))
                                    (in_RDI,0x14,
                                     "Existing string \'name\' has length %d, requested %d, unable to change"
                                     ,**(undefined4 **)(pcVar1 + 0x18),__n & 0xffffffff);
                  return eVar3;
                }
                eVar3 = exr_attr_string_set_with_length
                                  ((exr_context_t)CONCAT44(eVar3,in_stack_ffffffffffffffc8),s,
                                   (char *)CONCAT44(in_stack_ffffffffffffffbc,
                                                    in_stack_ffffffffffffffb8),
                                   (int32_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
              }
            }
            internal_exr_unlock(in_stack_ffffffffffffffb0);
          }
          else {
            internal_exr_unlock(in_stack_ffffffffffffffb0);
            eVar3 = (**(code **)(in_RDI + 0x48))
                              (in_RDI,3,"String too large to store (%lu bytes) into \'name\'",__n);
          }
        }
      }
    }
  }
  return eVar3;
}

Assistant:

exr_result_t
exr_set_name (exr_context_t ctxt, int part_index, const char* val)
{
    size_t bytes;
    REQ_ATTR_FIND_CREATE (name, EXR_ATTR_STRING);

    /* old library allowed an empty string :(, but ensure not null */
    if (!val)
        return EXR_UNLOCK_AND_RETURN (ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid string passed trying to set 'name'"));

    bytes = strlen (val);

    if (bytes >= (size_t) INT32_MAX)
        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "String too large to store (%" PRIu64 " bytes) into 'name'",
            (uint64_t) bytes));

    if (rv == EXR_ERR_SUCCESS)
    {
        if (ctxt->num_parts > 1)
        {
            for ( int pidx = 0; pidx < ctxt->num_parts; ++pidx )
            {
                const exr_attribute_t* pname;

                if (pidx == part_index)
                    continue;
                pname = ctxt->parts[pidx]->name;
                if (!pname)
                {
                    return EXR_UNLOCK_AND_RETURN (
                        ctxt->print_error (
                            ctxt,
                            EXR_ERR_INVALID_ARGUMENT,
                            "Part %d missing required attribute 'name' for multi-part file",
                            pidx));
                }
                if (!strcmp (val, pname->string->str))
                {
                    return EXR_UNLOCK_AND_RETURN (
                        ctxt->print_error (
                            ctxt,
                            EXR_ERR_INVALID_ARGUMENT,
                            "Each part should have a unique name, part %d and %d attempting to have same name '%s'",
                            pidx, part_index, val));
                }
            }
        }

        if (attr->string->length == (int32_t) bytes &&
            attr->string->alloc_size > 0)
        {
            /* we own the string... */
            memcpy (EXR_CONST_CAST (void*, attr->string->str), val, bytes);
        }
        else if (ctxt->mode != EXR_CONTEXT_WRITE && ctxt->mode != EXR_CONTEXT_TEMPORARY)
        {
            return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_MODIFY_SIZE_CHANGE,
                "Existing string 'name' has length %d, requested %d, unable to change",
                attr->string->length,
                (int32_t) bytes));
        }
        else
        {
            rv = exr_attr_string_set_with_length (
                ctxt, attr->string, val, (int32_t) bytes);
        }
    }

    return EXR_UNLOCK_AND_RETURN (rv);
}